

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest_test_compression_of_big_buffer_in_chunks_Test::
TestBody(ZLIBBufferCompressorTest_test_compression_of_big_buffer_in_chunks_Test *this)

{
  int j;
  ulong uVar1;
  int i;
  int iVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input_buffer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
             (this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_string_length << 10);
  for (iVar2 = 0; iVar2 != 0x400; iVar2 = iVar2 + 1) {
    for (uVar1 = 0; uVar1 < (this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_string_length;
        uVar1 = uVar1 + 1) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
                 (this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_dataplus._M_p + uVar1);
    }
  }
  ZLIBBufferCompressorTest::TestCompression
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
             &this->super_ZLIBBufferCompressorTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,0x10000);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, test_compression_of_big_buffer_in_chunks)
{
    std::vector<unsigned char> input_buffer;
    input_buffer.reserve(BIGGER_TEXT.size() * 1024);
    for (int i = 0; i < 1024; i++)
    {
        for (int j = 0; j < BIGGER_TEXT.size(); j++)
        {
            input_buffer.emplace_back(BIGGER_TEXT[j]);
        }
    }

    TestCompression(input_buffer, 65536);
}